

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

QString * __thiscall QTextBrowser::historyTitle(QTextBrowser *this,int i)

{
  long lVar1;
  HistoryEntry *in_RDI;
  long in_FS_OFFSET;
  QTextBrowserPrivate *d;
  HistoryEntry *this_00;
  int in_stack_ffffffffffffffc4;
  QTextBrowserPrivate *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QTextBrowser *)0x6df81a);
  QTextBrowserPrivate::history(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  QString::QString((QString *)this_00,(QString *)in_RDI);
  QTextBrowserPrivate::HistoryEntry::~HistoryEntry(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextBrowser::historyTitle(int i) const
{
    Q_D(const QTextBrowser);
    return d->history(i).title;
}